

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintFactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar2;
  uint fUseRealNames;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fUseRealNames = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"nh"), iVar1 == 0x6e) {
    fUseRealNames = fUseRealNames ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else {
      if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
        if (argc <= globalUtilOptind + 1) {
          if (globalUtilOptind + 1 != argc) {
            Abc_NtkPrintFactor(_stdout,pNtk,fUseRealNames);
            return 0;
          }
          pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
          if (pNode == (Abc_Obj_t *)0x0) {
            Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
            return 1;
          }
          Abc_NodePrintFactor(_stdout,pNode,fUseRealNames);
          return 0;
        }
        Abc_Print(-1,"Wrong number of auguments.\n");
        goto LAB_001f0685;
      }
      pcVar2 = "Printing factored forms can be done for SOP networks.\n";
    }
    iVar1 = -1;
  }
  else {
LAB_001f0685:
    iVar1 = -2;
    Abc_Print(-2,"usage: print_factor [-nh] <node>\n");
    Abc_Print(-2,"\t        prints the factored forms of nodes\n");
    pcVar2 = "real";
    if (fUseRealNames == 0) {
      pcVar2 = "dummy";
    }
    Abc_Print(-2,"\t-n    : toggles real/dummy fanin names [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pcVar2 = "\tnode  : (optional) one node to consider\n";
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandPrintFactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fUseRealNames;

    // set defaults
    fUseRealNames = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fUseRealNames ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Printing factored forms can be done for SOP networks.\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintFactor( stdout, pNode, fUseRealNames );
        return 0;
    }
    // print the nodes
    Abc_NtkPrintFactor( stdout, pNtk, fUseRealNames );
    return 0;

usage:
    Abc_Print( -2, "usage: print_factor [-nh] <node>\n" );
    Abc_Print( -2, "\t        prints the factored forms of nodes\n" );
    Abc_Print( -2, "\t-n    : toggles real/dummy fanin names [default = %s]\n", fUseRealNames? "real": "dummy" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : (optional) one node to consider\n");
    return 1;
}